

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O2

void __thiscall DHUDMessage::Draw(DHUDMessage *this,int bottom,int visibility)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  int local_40;
  uint local_3c;
  float intpart;
  
  if ((this->VisibilityFlags & visibility) != 0) {
    return;
  }
  (*(this->super_DObject)._vptr_DObject[8])();
  iVar5 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
  iVar3 = 1;
  if (this->HUDWidth == 0) {
    iVar4 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar2 = active_con_scaletext();
    bVar10 = iVar2 == 0;
    if (bVar10) {
      local_40 = CleanYfac;
      iVar3 = CleanXfac;
    }
    else {
      if (this->HUDWidth != 0) goto LAB_004affff;
      iVar3 = active_con_scaletext();
      iVar4 = iVar4 / iVar3;
      iVar3 = active_con_scaletext();
      iVar5 = iVar5 / iVar3;
      iVar3 = active_con_scaletext();
      bottom = bottom / iVar3;
      local_40 = 1;
      iVar3 = local_40;
    }
    if (this->HUDWidth == 0) {
      fVar11 = this->Left;
      if (fVar11 <= 0.0) {
        fVar11 = -fVar11;
      }
      else {
        iVar4 = iVar4 - this->Width * iVar3;
      }
      local_3c = (uint)(fVar11 * (float)iVar4);
      fVar11 = this->Top;
      if (fVar11 <= 0.0) {
        fVar11 = -fVar11;
        iVar4 = bottom;
      }
      else {
        iVar4 = bottom - this->Height * local_40;
      }
      uVar1 = (uint)(fVar11 * (float)iVar4);
      goto LAB_004b019d;
    }
  }
  else {
LAB_004affff:
    bVar10 = false;
    local_40 = iVar3;
  }
  fVar11 = modff(this->Left,&intpart);
  local_3c = (uint)intpart;
  uVar1 = (int)(ABS(fVar11) * 10.0 + 0.5) & 3;
  if (uVar1 == 2) {
    local_3c = local_3c - this->Width;
  }
  else if (uVar1 == 0) {
    local_3c = local_3c + this->Width / -2;
  }
  fVar11 = modff(this->Top,&intpart);
  uVar1 = (uint)intpart;
  uVar6 = (int)(ABS(fVar11) * 10.0 + 0.5) & 3;
  if (uVar6 == 2) {
    uVar1 = uVar1 - this->Height;
  }
  else if (uVar6 == 0) {
    uVar1 = uVar1 + this->Height / -2;
  }
LAB_004b019d:
  if (this->CenterX == true) {
    local_3c = local_3c + (this->Width * iVar3) / 2;
  }
  iVar4 = this->Font->FontHeight;
  iVar2 = this->HUDHeight;
  if ((long)iVar2 < 0) {
    uVar7 = (ulong)(uint)-iVar2;
  }
  else {
    uVar7 = ((long)iVar2 * (long)iVar5) / (long)bottom;
  }
  CalcClipCoords(this,(int)uVar7);
  lVar8 = 0;
  for (uVar9 = 0; (long)uVar9 < (long)this->NumLines; uVar9 = uVar9 + 1) {
    uVar6 = local_3c;
    if (this->CenterX == true) {
      uVar6 = (*(int *)((long)&this->Lines->Width + lVar8) * iVar3) / -2 + local_3c;
    }
    (*(this->super_DObject)._vptr_DObject[9])
              (this,uVar9 & 0xffffffff,(ulong)uVar6,(ulong)uVar1,bVar10,uVar7 & 0xffffffff);
    uVar1 = uVar1 + local_40 * iVar4;
    lVar8 = lVar8 + 0x10;
  }
  return;
}

Assistant:

void DHUDMessage::Draw (int bottom, int visibility)
{
	int xscale, yscale;
	int x, y;
	int ystep;
	int i;
	bool clean = false;
	int hudheight;

	// If any of the visibility flags match, do NOT draw this message.
	if (VisibilityFlags & visibility)
	{
		return;
	}

	DrawSetup ();

	int screen_width = SCREENWIDTH;
	int screen_height = SCREENHEIGHT;
	if (HUDWidth == 0 && active_con_scaletext() == 0)
	{
		clean = true;
		xscale = CleanXfac;
		yscale = CleanYfac;
	}
	else
	{
		xscale = yscale = 1;
		if (HUDWidth == 0)
		{
			screen_width /= active_con_scaletext();
			screen_height /= active_con_scaletext();
			bottom /= active_con_scaletext();
		}
	}

	if (HUDWidth == 0)
	{
		if (Left > 0.f)
		{ // Position center
			x = (int)((float)(screen_width - Width * xscale) * Left);
		}
		else
		{ // Position edge
			x = (int)((float)screen_width * -Left);
		}
		if (Top > 0.f)
		{ // Position center
			y = (int)((float)(bottom - Height * yscale) * Top);
		}
		else
		{ // Position edge
			y = (int)((float)bottom * -Top);
		}
	}
	else
	{
		float intpart;
		int fracpart;

		fracpart = (int)(fabsf (modff (Left, &intpart)) * 10.f + 0.5f);
		x = (int)intpart;
		switch (fracpart & 3)
		{
		case 0: // Position center
			x -= Width / 2;
			break;

		case 2: // Position right
			x -= Width;
			break;
		}

		fracpart = (int)(fabsf (modff (Top, &intpart)) * 10.f + 0.5f);
		y = (int)intpart;
		switch (fracpart & 3)
		{
		case 0: // Position center
			y -= Height / 2;
			break;

		case 2: // Position bottom
			y -= Height;
			break;
		}
	}

	if (CenterX)
	{
		x += Width * xscale / 2;
	}

	ystep = Font->GetHeight() * yscale;

	if (HUDHeight < 0)
	{ // A negative height means the HUD size covers the status bar
		hudheight = -HUDHeight;
	}
	else
	{ // A positive height means the HUD size does not cover the status bar
		hudheight = Scale (HUDHeight, screen_height, bottom);
	}
	CalcClipCoords(hudheight);

	for (i = 0; i < NumLines; i++)
	{
		int drawx;

		drawx = CenterX ? x - Lines[i].Width*xscale/2 : x;
		DoDraw (i, drawx, y, clean, hudheight);
		y += ystep;
	}
}